

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O0

bool __thiscall Js::AsmJsEncoder::ReadOp(AsmJsEncoder *this)

{
  code *pcVar1;
  bool bVar2;
  OpCodeAsmJs op_00;
  uint uVar3;
  LocalFunctionId LVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  ByteBlock *this_00;
  undefined4 *puVar8;
  LayoutSize local_20;
  uint uStack_1c;
  OpCodeAsmJs op;
  LayoutSize layoutSize;
  int bytecodeoffset;
  AsmJsEncoder *this_local;
  
  _layoutSize = this;
  uStack_1c = ByteCodeReader::GetCurrentOffset(&this->mReader);
  op_00 = ByteCodeReader::ReadOp(&this->mReader,&local_20);
  pbVar6 = ByteCodeReader::GetIP(&this->mReader);
  this->ip = pbVar6;
  uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->mFunctionBody);
  LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->mFunctionBody);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsEncoderPhase,uVar3,LVar4);
  if (bVar2) {
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->mFunctionBody);
    LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->mFunctionBody);
    Output::Print(L"%d.%d:Encoding ",(ulong)uVar3,(ulong)LVar4);
    AsmJsByteCodeDumper::DumpOp(op_00,local_20,&this->mReader,this->mFunctionBody);
    pbVar6 = this->ip;
    pbVar7 = ByteCodeReader::GetIP(&this->mReader);
    if (pbVar6 != pbVar7) {
      ByteCodeReader::SetIP(&this->mReader,this->ip);
    }
    Output::Print(L"  at offset 0x%X (buffer size = 0x%X)\n",(ulong)uStack_1c,
                  (ulong)(uint)((int)this->mPc - (int)this->mEncodeBuffer));
    Output::Flush();
  }
  if (op_00 == EndOfBlock) {
    uVar3 = ByteCodeReader::GetCurrentOffset(&this->mReader);
    this_00 = FunctionBody::GetByteCode(this->mFunctionBody);
    uVar5 = ByteBlock::GetLength(this_00);
    if (uVar3 != uVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsEncoder.cpp"
                                  ,0x89,
                                  "(mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength())"
                                  ,
                                  "mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    this_local._7_1_ = false;
  }
  else {
    if (local_20 == SmallLayout) {
      ReadOpTemplate<(Js::LayoutSize)0>(this,op_00);
    }
    else if (local_20 == MediumLayout) {
      ReadOpTemplate<(Js::LayoutSize)1>(this,op_00);
    }
    else if (local_20 == LargeLayout) {
      ReadOpTemplate<(Js::LayoutSize)2>(this,op_00);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsEncoder::ReadOp()
    {
#if DBG_DUMP
        int bytecodeoffset = mReader.GetCurrentOffset();
#endif
        LayoutSize layoutSize;
        OpCodeAsmJs op = (OpCodeAsmJs)mReader.ReadOp(layoutSize);
        ip = mReader.GetIP();
#if DBG_DUMP
        if (PHASE_TRACE(Js::AsmjsEncoderPhase, mFunctionBody))
        {
            Output::Print(_u("%d.%d:Encoding "),
                           this->mFunctionBody->GetSourceContextId(),
                           this->mFunctionBody->GetLocalFunctionId());
            AsmJsByteCodeDumper::DumpOp( op, layoutSize, mReader, mFunctionBody );
            if( ip != mReader.GetIP() )
            {
                mReader.SetIP( ip );
            }
            Output::Print(_u("  at offset 0x%X (buffer size = 0x%X)\n"),
                           bytecodeoffset, (int)(mPc-mEncodeBuffer));
            Output::Flush();
        }
#endif
        if( op == OpCodeAsmJs::EndOfBlock )
        {
            Assert(mReader.GetCurrentOffset() == mFunctionBody->GetByteCode()->GetLength());
            // last bytecode
            return false;
        }
        switch( layoutSize )
        {
        case Js::SmallLayout:
            ReadOpTemplate<Js::SmallLayout>( op );
            break;
        case Js::MediumLayout:
            ReadOpTemplate<Js::MediumLayout>( op );
            break;
        case Js::LargeLayout:
            ReadOpTemplate<Js::LargeLayout>( op );
            break;
        default:
            break;
        }
        return true;
    }